

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool skipHeader;
  int iVar2;
  undefined8 uVar3;
  allocator local_196;
  allocator local_195;
  undefined4 local_194;
  int local_190;
  uint local_18c;
  string local_188;
  string local_168;
  FILE *fout [2];
  string local_138;
  string local_118;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parquetOutFiles;
  sigaction sa;
  
  progname = *argv;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fout[0] = (FILE *)0x0;
  fout[1] = (FILE *)0x0;
  local_18c = 0;
  local_194 = 0;
  local_190 = 0;
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = false;
  do {
    skipHeader = bVar1;
    iVar2 = getopt(argc,argv,"vshP:M:m:Q:q:");
    bVar1 = true;
    switch(iVar2) {
    case 0x6d:
    case 0x71:
      local_18c = CONCAT31((int3)((uint)iVar2 >> 8),1);
      bVar1 = skipHeader;
      break;
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x74:
    case 0x75:
switchD_00104267_caseD_6e:
      help();
LAB_001044ca:
      exit(1);
    case 0x73:
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      goto LAB_001044ca;
    default:
      if (iVar2 == -1) {
        if ((local_18c & 1) == 0) {
          memset(&sa,0,0x98);
          sigemptyset((sigset_t *)&sa.sa_mask);
          sa.__sigaction_handler.sa_handler = segfault_sigaction;
          sa.sa_flags = 4;
          sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
          std::__cxx11::string::string((string *)&local_118,"",(allocator *)&local_188);
          std::__cxx11::string::string((string *)&local_138,"",(allocator *)&local_168);
          initstreams(&local_118,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_118);
          eltcalc::setinitdone(local_190);
          std::__cxx11::string::string((string *)&local_188,progname,&local_195);
          std::__cxx11::string::string((string *)&local_168,"INFO",&local_196);
          logprintf(&local_188,&local_168,"starting process..\n");
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_188);
          eltcalc::doit(skipHeader,(bool)((byte)local_194 & 1),fout,&parquetOutFiles);
          std::__cxx11::string::string((string *)&local_188,progname,&local_195);
          std::__cxx11::string::string((string *)&local_168,"INFO",&local_196);
          logprintf(&local_188,&local_168,"finishing process..\n");
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_188);
          std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&parquetOutFiles._M_t);
          return 0;
        }
        fwrite("FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
               ,0x79,1,_stderr);
        goto LAB_001044ca;
      }
      if (iVar2 == 0x4d) {
        std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_188);
        iVar2 = 0;
      }
      else {
        if (iVar2 == 0x50) {
          local_190 = atoi(_optarg);
          bVar1 = skipHeader;
          break;
        }
        if (iVar2 != 0x51) goto switchD_00104267_caseD_6e;
        std::__cxx11::string::string((string *)&sa,_optarg,(allocator *)&local_188);
        iVar2 = 1;
      }
      openpipe(iVar2,(string *)&sa,fout);
      uVar3 = std::__cxx11::string::~string((string *)&sa);
      local_194 = (undefined4)CONCAT71((int7)((ulong)uVar3 >> 8),1);
      bVar1 = skipHeader;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];

	enum { MELT = 0, QELT };

	bool skipHeader = false;
	bool ordOutput = false;
	FILE * fout[] = { nullptr, nullptr };
	bool parquetOutput = false;
	std::map<int, std::string> parquetOutFiles;
	int opt;
	int processid = 0;
	while ((opt = getopt(argc, argv, "vshP:M:m:Q:q:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'M':
			ordOutput = true;
			openpipe(MELT, optarg, fout);
			break;
		case 'm':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::MELT] = optarg;
#endif
			break;
		case 'Q':
			ordOutput = true;
			openpipe(QELT, optarg, fout);
			break;
		case 'q':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::QELT] = optarg;
#endif
			break;
		case 'P':
			processid = atoi(optarg);
			break;
		case 's':
			skipHeader = true;
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquetOutput) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif
	try {
		initstreams();
		eltcalc::setinitdone(processid);
        	logprintf(progname, "INFO", "starting process..\n");
		eltcalc::doit(skipHeader, ordOutput, fout, parquetOutFiles);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}